

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

void Au_NtkTerSimulate_rec(Au_Ntk_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Au_Obj_t *pAVar5;
  Au_Ntk_t *p_00;
  Au_Obj_t *pAVar6;
  Au_Obj_t *pAVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint Value;
  
  if (0 < (p->vPis).nSize) {
    pAVar5 = Au_NtkPi(p,0);
    (*(code *)(&DAT_0088346c + *(int *)(&DAT_0088346c + (ulong)(*(uint *)pAVar5 >> 0x1e) * 4)))();
    return;
  }
  iVar1 = strcmp(p->pName,"ref_egcd");
  if (iVar1 == 0) {
    printf("Replacing one instance of recursive model \"%s\" by a black box.\n","ref_egcd");
    for (iVar1 = 0; iVar1 < (p->vPos).nSize; iVar1 = iVar1 + 1) {
      pAVar5 = Au_NtkPo(p,iVar1);
      *(ulong *)pAVar5 = *(ulong *)pAVar5 | 0xc0000000;
    }
  }
  else {
    pAVar5 = (Au_Obj_t *)0x0;
    for (iVar1 = 0; iVar1 < (p->vObjs).nSize; iVar1 = iVar1 + 1) {
      pAVar5 = Au_NtkObjI(p,iVar1);
      uVar10 = *(ulong *)pAVar5;
      uVar9 = uVar10 & 0x700000000;
      if (uVar9 == 0x100000000) {
        uVar10 = uVar10 & 0xfffffff93fffffff | 0x40000000;
LAB_006ba5fc:
        *(ulong *)pAVar5 = uVar10;
      }
      else if (uVar9 == 0x600000000) {
        p_00 = Au_ObjModel(pAVar5);
        if (p_00->nObjs[2] != (uint)((ulong)*(undefined8 *)pAVar5 >> 0x23)) {
          __assert_fail("Au_ObjFaninNum(pObj) == Au_NtkPiNum(pModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                        ,0x552,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
        }
        iVar3 = Au_BoxFanoutNum(pAVar5);
        if (iVar3 != p_00->nObjs[3]) {
          __assert_fail("Au_BoxFanoutNum(pObj) == Au_NtkPoNum(pModel)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                        ,0x553,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
        }
        for (uVar2 = 0; uVar2 < (uint)((ulong)*(undefined8 *)pAVar5 >> 0x23); uVar2 = uVar2 + 1) {
          pAVar7 = Au_ObjFanin(pAVar5,uVar2);
          pAVar6 = Au_NtkPi(p_00,uVar2);
          *(ulong *)pAVar6 =
               *(ulong *)pAVar6 & 0xffffffff3fffffff |
               (ulong)((uint)*(undefined8 *)pAVar7 & 0xc0000000);
        }
        Au_NtkTerSimulate_rec(p_00);
        for (iVar3 = 0; iVar4 = Au_BoxFanoutNum(pAVar5), iVar3 < iVar4; iVar3 = iVar3 + 1) {
          pAVar7 = Au_BoxFanout(pAVar5,iVar3);
          pAVar6 = Au_NtkPo(p_00,iVar3);
          *(ulong *)pAVar7 =
               *(ulong *)pAVar7 & 0xffffffff3fffffff |
               (ulong)((uint)*(undefined8 *)pAVar6 & 0xc0000000);
        }
      }
      else if (uVar9 == 0x700000000) {
        uVar2 = (uint)uVar10 & 0x3fffffff;
        if (uVar2 == 3) {
          iVar3 = Au_ObjGetXsimFan0(pAVar5);
          uVar2 = Au_ObjGetXsimFan1(pAVar5);
          pAVar7 = Au_ObjFanin2(pAVar5);
          Value = *(uint *)pAVar7 >> 0x1e;
          iVar4 = Au_ObjFaninC2(pAVar5);
          if (iVar4 != 0) {
            Value = Au_XsimInv(Value);
          }
          uVar8 = Value;
          if (((iVar3 != 1) && (uVar8 = uVar2, iVar3 != 2)) &&
             ((uVar2 != 1 || (uVar8 = 1, Value != 1)))) {
            uVar8 = (uVar2 == 2 && Value == 2) ^ 3;
          }
          uVar10 = (ulong)(uVar8 << 0x1e);
        }
        else if (uVar2 == 2) {
          iVar3 = Au_ObjGetXsimFan0(pAVar5);
          iVar4 = Au_ObjGetXsimFan1(pAVar5);
          uVar10 = 0x80000000;
          if ((iVar4 != 1) != (iVar3 == 1)) {
            uVar10 = 0x40000000;
          }
          if (iVar4 == 3) {
            uVar10 = 0xc0000000;
          }
          if (iVar3 == 3) {
            uVar10 = 0xc0000000;
          }
        }
        else {
          if (uVar2 != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                          ,0x54c,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
          }
          iVar3 = Au_ObjGetXsimFan0(pAVar5);
          iVar4 = Au_ObjGetXsimFan1(pAVar5);
          uVar10 = 0x40000000;
          if ((iVar4 != 1 && iVar3 != 1) && (uVar10 = 0xc0000000, iVar4 != 3 && iVar3 != 3)) {
            if ((iVar3 != 2) || (iVar4 != 2)) {
              __assert_fail("Value0 == AU_VAL1 && Value1 == AU_VAL1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                            ,0x4fb,"int Au_XsimAnd(int, int)");
            }
            uVar10 = 0x80000000;
          }
        }
        uVar10 = *(ulong *)pAVar5 & 0xffffffff3fffffff | uVar10;
        goto LAB_006ba5fc;
      }
    }
    for (iVar1 = 0; iVar3 = (p->vPos).nSize, iVar1 < iVar3; iVar1 = iVar1 + 1) {
      pAVar7 = Au_NtkPo(p,iVar1);
      iVar3 = Au_ObjGetXsimFan0(pAVar5);
      *(ulong *)pAVar7 = *(ulong *)pAVar7 & 0xffffffff3fffffff | (ulong)(uint)(iVar3 << 0x1e);
    }
    if (0 < iVar3) {
      pAVar5 = Au_NtkPo(p,0);
      (*(code *)(&DAT_0088345c + *(int *)(&DAT_0088345c + (ulong)(*(uint *)pAVar5 >> 0x1e) * 4)))();
      return;
    }
  }
  return;
}

Assistant:

void Au_NtkTerSimulate_rec( Au_Ntk_t * p )
{ 
    Au_Obj_t * pObj = NULL, * pTerm;
    int i, k;
    Au_NtkForEachPi( p, pTerm, i )
    {
        assert( Au_ObjGetXsim(pTerm) > 0 );
        if ( Au_ObjGetXsim(pTerm) == AU_VALX )
            p->pMan->nPortsNC++;
        else if ( Au_ObjGetXsim(pTerm) == AU_VAL0 )
            p->pMan->nPortsC0++;
        else
            p->pMan->nPortsC1++;
    }
    if ( strcmp(Au_NtkName(p), "ref_egcd") == 0 )
    {
        printf( "Replacing one instance of recursive model \"%s\" by a black box.\n", "ref_egcd" );
        Au_NtkForEachPo( p, pTerm, i )
            Au_ObjSetXsim( pTerm, AU_VALX );
        return;
    }
    Au_NtkForEachObj( p, pObj, i )
    {
        if ( Au_ObjIsNode(pObj) )
        {
            if ( pObj->Func == 1 )
                Au_ObjSetXsim( pObj, Au_XsimAnd(Au_ObjGetXsimFan0(pObj), Au_ObjGetXsimFan1(pObj)) );
            else if ( pObj->Func == 2 )
                Au_ObjSetXsim( pObj, Au_XsimXor(Au_ObjGetXsimFan0(pObj), Au_ObjGetXsimFan1(pObj)) );
            else if ( pObj->Func == 3 )
                Au_ObjSetXsim( pObj, Au_XsimMux(Au_ObjGetXsimFan0(pObj), Au_ObjGetXsimFan1(pObj), Au_ObjGetXsimFan2(pObj)) );
            else assert( 0 );
        }
        else if ( Au_ObjIsBox(pObj) )
        {
            Au_Ntk_t * pModel = Au_ObjModel(pObj);
            // check the match between the number of actual and formal parameters
            assert( Au_ObjFaninNum(pObj) == Au_NtkPiNum(pModel) );
            assert( Au_BoxFanoutNum(pObj) == Au_NtkPoNum(pModel) );
            // assign PIs
            Au_ObjForEachFanin( pObj, pTerm, k )
                Au_ObjSetXsim( Au_NtkPi(pModel, k), Au_ObjGetXsim(pTerm) );
            // call recursively
            Au_NtkTerSimulate_rec( pModel );
            // assign POs
            Au_BoxForEachFanout( pObj, pTerm, k )
                Au_ObjSetXsim( pTerm, Au_ObjGetXsim(Au_NtkPo(pModel, k)) );
        }
        else if ( Au_ObjIsConst0(pObj) )
            Au_ObjSetXsim( pObj, AU_VAL0 );
            
    }
    Au_NtkForEachPo( p, pTerm, i )
        Au_ObjSetXsim( pTerm, Au_ObjGetXsimFan0(pObj) );
    Au_NtkForEachPo( p, pTerm, i )
    {
        assert( Au_ObjGetXsim(pTerm) > 0 );
        if ( Au_ObjGetXsim(pTerm) == AU_VALX )
            p->pMan->nPortsNC++;
        else if ( Au_ObjGetXsim(pTerm) == AU_VAL0 )
            p->pMan->nPortsC0++;
        else
            p->pMan->nPortsC1++;
    }
}